

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::setUniform
          (GLShaderProgram *this,string *name,vec3 val)

{
  bool bVar1;
  __type _Var2;
  reference pGVar3;
  invalid_argument *piVar4;
  long in_RDI;
  undefined1 in_ZMM0 [64];
  GLfloat in_XMM1_Da;
  GLShaderUniform *u;
  iterator __end2;
  iterator __begin2;
  vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>
  *__range2;
  vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>
  *in_stack_ffffffffffffff58;
  __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>_>
  *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>_>
  local_40;
  long local_38;
  undefined8 local_1c;
  undefined8 local_c;
  GLfloat local_4;
  
  local_1c = vmovlpd_avx(in_ZMM0._0_16_);
  local_c = local_1c;
  local_4 = in_XMM1_Da;
  (*glad_glUseProgram)(*(GLuint *)(in_RDI + 0x78));
  local_38 = in_RDI + 0x30;
  local_40._M_current =
       (GLShaderUniform *)
       std::
       vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>
       ::begin(in_stack_ffffffffffffff58);
  std::
  vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>
  ::end(in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff60,
                       (__normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar1) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      std::invalid_argument::invalid_argument(piVar4,(string *)&stack0xffffffffffffff80);
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    pGVar3 = __gnu_cxx::
             __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>_>
             ::operator*(&local_40);
    _Var2 = std::operator==(in_stack_ffffffffffffff80,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderProgram::GLShaderUniform>_>_>
    ::operator++(&local_40);
  }
  if (pGVar3->type == Vector3Float) {
    (*glad_glUniform3f)(pGVar3->location,(GLfloat)local_c,local_c._4_4_,local_4);
    pGVar3->isSet = true;
    return;
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar4,"Tried to set GLShaderUniform with wrong type");
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void GLShaderProgram::setUniform(std::string name, glm::vec3 val) {
  glUseProgram(programHandle);

  for (GLShaderUniform& u : uniforms) {
    if (u.name == name) {
      if (u.type == DataType::Vector3Float) {
        glUniform3f(u.location, val.x, val.y, val.z);
        u.isSet = true;
      } else {
        throw std::invalid_argument("Tried to set GLShaderUniform with wrong type");
      }
      return;
    }
  }
  throw std::invalid_argument("Tried to set nonexistent uniform with name " + name);
}